

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

cmJSONHelper<std::vector<map<basic_string<char>,_vector<Resource,_allocator<Resource>_>,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_vector<Resource,_allocator<Resource>_>_>_>_>_>,_cmCTestResourceSpec::ReadFileResult>
* __thiscall
cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::
Vector<std::map<std::__cxx11::string,std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>>>>,std::function<cmCTestResourceSpec::ReadFileResult(std::map<std::__cxx11::string,std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>>>>&,Json::Value_const*)>>
          (cmJSONHelper<std::vector<map<basic_string<char>,_vector<Resource,_allocator<Resource>_>,_less<basic_string<char>_>,_allocator<pair<const_basic_string<char>,_vector<Resource,_allocator<Resource>_>_>_>_>_>,_cmCTestResourceSpec::ReadFileResult>
           *__return_storage_ptr__,cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult> *this,
          ReadFileResult success,ReadFileResult fail,
          function<cmCTestResourceSpec::ReadFileResult_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>_&,_const_Json::Value_*)>
          *func)

{
  undefined4 in_register_0000000c;
  function<cmCTestResourceSpec::ReadFileResult_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>_&,_const_Json::Value_*)>
  local_40;
  function<cmCTestResourceSpec::ReadFileResult_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>_&,_const_Json::Value_*)>
  *local_20;
  function<cmCTestResourceSpec::ReadFileResult_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>_&,_const_Json::Value_*)>
  *func_local;
  ReadFileResult fail_local;
  ReadFileResult success_local;
  
  local_20 = (function<cmCTestResourceSpec::ReadFileResult_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>_&,_const_Json::Value_*)>
              *)CONCAT44(in_register_0000000c,fail);
  func_local._4_4_ = SUB84(this,0);
  func_local._0_4_ = success;
  _fail_local = __return_storage_ptr__;
  std::
  function<cmCTestResourceSpec::ReadFileResult_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>_&,_const_Json::Value_*)>
  ::function(&local_40,local_20);
  VectorFilter<std::map<std::__cxx11::string,std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>>>>,std::function<cmCTestResourceSpec::ReadFileResult(std::map<std::__cxx11::string,std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>>>>&,Json::Value_const*)>,cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult>::Vector<std::map<std::__cxx11::string,std::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<cmCTestResourceSpec::Resource,std::allocator<___d::vector<cmCTestResourceSpec::Resource,std::allocator<cmCTestResourceSpec::Resource>>>>>const&)_1_>
            (__return_storage_ptr__,
             (cmJSONHelperBuilder<cmCTestResourceSpec::ReadFileResult> *)((ulong)this & 0xffffffff),
             success,&local_40);
  std::
  function<cmCTestResourceSpec::ReadFileResult_(std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmCTestResourceSpec::Resource,_std::allocator<cmCTestResourceSpec::Resource>_>_>_>_>_&,_const_Json::Value_*)>
  ::~function(&local_40);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<std::vector<T>, E, CallState...> Vector(E success,
                                                              E fail, F func)
  {
    return VectorFilter<T, F>(success, fail, func,
                              [](const T&) { return true; });
  }